

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

bool __thiscall cmCursesMainForm::LookForCacheEntry(cmCursesMainForm *this,string *key)

{
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar1;
  cmCursesCacheEntryComposite **ppcVar2;
  bool bVar3;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  __it;
  long lVar4;
  long lVar5;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  _Var6;
  string *local_38;
  
  pvVar1 = this->Entries;
  if (pvVar1 == (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 *)0x0) {
    return false;
  }
  __it._M_current =
       (pvVar1->
       super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (pvVar1->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)ppcVar2 - (long)__it._M_current;
  local_38 = key;
  for (lVar4 = lVar5 >> 5; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                        *)&local_38,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_00138492;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                        *)&local_38,
                       (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                        )(__it._M_current + 1));
    _Var6._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_00138492;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                        *)&local_38,
                       (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                        )(__it._M_current + 2));
    _Var6._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_00138492;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                        *)&local_38,
                       (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                        )(__it._M_current + 3));
    _Var6._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_00138492;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = ppcVar2;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                                *)&local_38,__it), _Var6._M_current = __it._M_current, bVar3))
      goto LAB_00138492;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                        *)&local_38,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_00138492;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                      *)&local_38,__it);
  _Var6._M_current = __it._M_current;
  if (!bVar3) {
    _Var6._M_current = ppcVar2;
  }
LAB_00138492:
  return _Var6._M_current != ppcVar2;
}

Assistant:

bool cmCursesMainForm::LookForCacheEntry(const std::string& key)
{
  return this->Entries &&
    std::any_of(this->Entries->begin(), this->Entries->end(),
                [&key](cmCursesCacheEntryComposite* entry) {
                  return key == entry->Key;
                });
}